

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

QSize __thiscall QGraphicsView::sizeHint(QGraphicsView *this)

{
  bool bVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  uint uVar4;
  undefined8 uVar5;
  QSize QVar6;
  long in_FS_OFFSET;
  long lVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  QRectF local_68;
  QRectF local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = *(long *)(this + 8);
  if (((*(long *)(lVar7 + 0x490) == 0) || (*(int *)(*(long *)(lVar7 + 0x490) + 4) == 0)) ||
     (*(long *)(lVar7 + 0x498) == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QVar6 = QAbstractScrollArea::sizeHint((QAbstractScrollArea *)this);
      return QVar6;
    }
  }
  else {
    sceneRect(&local_68,this);
    QTransform::mapRect(&local_48);
    dVar8 = (double)(*(short *)(lVar7 + 0x26c) * 2);
    dVar9 = dVar8 + local_48.w;
    dVar8 = dVar8 + local_48.h;
    QGuiApplication::primaryScreen();
    uVar5 = QScreen::virtualSize();
    dVar10 = (double)(int)uVar5 * 3.0;
    dVar14 = (double)(int)((ulong)uVar5 >> 0x20) * 3.0;
    auVar11._0_8_ = (double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10;
    auVar11._8_8_ = (double)((ulong)dVar14 & 0x8000000000000000 | 0x3fe0000000000000) + dVar14;
    auVar12 = maxpd(auVar11,_DAT_006605e0);
    dVar10 = (double)(int)(double)(~-(ulong)(2147483647.0 < auVar11._0_8_) & auVar12._0_8_ |
                                  -(ulong)(2147483647.0 < auVar11._0_8_) & 0x41dfffffffc00000) *
             0.25;
    dVar14 = (double)(int)(double)(~-(ulong)(2147483647.0 < auVar11._8_8_) & auVar12._8_8_ |
                                  -(ulong)(2147483647.0 < auVar11._8_8_) & 0x41dfffffffc00000) *
             0.25;
    auVar15._0_8_ = (double)((ulong)dVar10 & 0x8000000000000000 | 0x3fe0000000000000) + dVar10;
    auVar15._8_8_ = (double)((ulong)dVar14 & 0x8000000000000000 | 0x3fe0000000000000) + dVar14;
    auVar12 = maxpd(auVar15,_DAT_006605e0);
    uVar3 = -(ulong)(2147483647.0 < auVar15._8_8_) & 0x41dfffffffc00000;
    auVar13._0_8_ = ~-(ulong)(2147483647.0 < auVar15._0_8_) & auVar12._0_8_;
    auVar13._8_8_ = ~-(ulong)(2147483647.0 < auVar15._8_8_) & auVar12._8_8_;
    auVar12._8_4_ = (int)uVar3;
    auVar12._0_8_ = -(ulong)(2147483647.0 < auVar15._0_8_) & 0x41dfffffffc00000;
    auVar12._12_4_ = (int)(uVar3 >> 0x20);
    dVar10 = (double)(int)SUB168(auVar13 | auVar12,0);
    dVar14 = (double)(int)SUB168(auVar13 | auVar12,8);
    lVar7 = -(ulong)(dVar8 < dVar14);
    auVar2._8_4_ = (int)lVar7;
    auVar2._0_8_ = -(ulong)(dVar9 < dVar10);
    auVar2._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar4 = movmskpd((int)uVar5,auVar2);
    if ((uVar4 & 1) == 0) {
      dVar9 = dVar10;
    }
    if ((uVar4 & 2) == 0) {
      dVar8 = dVar14;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      dVar9 = (double)((ulong)dVar9 & 0x8000000000000000 | 0x3fe0000000000000) + dVar9;
      bVar1 = 2147483647.0 < dVar9;
      if (dVar9 <= -2147483648.0) {
        dVar9 = -2147483648.0;
      }
      QVar6.wd.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 |
                                  ~-(ulong)bVar1 & (ulong)dVar9);
      dVar8 = (double)((ulong)dVar8 & 0x8000000000000000 | 0x3fe0000000000000) + dVar8;
      bVar1 = 2147483647.0 < dVar8;
      if (dVar8 <= -2147483648.0) {
        dVar8 = -2147483648.0;
      }
      QVar6.ht.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 |
                                  ~-(ulong)bVar1 & (ulong)dVar8);
      return QVar6;
    }
  }
  __stack_chk_fail();
}

Assistant:

QSize QGraphicsView::sizeHint() const
{
    Q_D(const QGraphicsView);
    if (d->scene) {
        QSizeF baseSize = d->matrix.mapRect(sceneRect()).size();
        baseSize += QSizeF(d->frameWidth * 2, d->frameWidth * 2);
        return baseSize.boundedTo((3 * QGuiApplication::primaryScreen()->virtualSize()) / 4).toSize();
    }
    return QAbstractScrollArea::sizeHint();
}